

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::TestUtilTest_TimestampIntegerConversion_Test::TestBody
          (TestUtilTest_TimestampIntegerConversion_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Timestamp *timestamp;
  Timestamp *timestamp_00;
  Timestamp *timestamp_01;
  Timestamp *timestamp_02;
  Timestamp *timestamp_03;
  Timestamp *timestamp_04;
  Timestamp *timestamp_05;
  Timestamp *timestamp_06;
  AssertHelper local_6d0;
  Message local_6c8;
  Timestamp local_6c0;
  int64_t local_698;
  int local_68c;
  undefined1 local_688 [8];
  AssertionResult gtest_ar_17;
  Message local_670;
  Timestamp local_668;
  int64_t local_640;
  int local_634;
  undefined1 local_630 [8];
  AssertionResult gtest_ar_16;
  Message local_618;
  Timestamp local_610;
  int64_t local_5e8;
  int local_5dc;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar_15;
  Message local_5c0;
  Timestamp local_5b8;
  int64_t local_590;
  int local_584;
  undefined1 local_580 [8];
  AssertionResult gtest_ar_14;
  Message local_568;
  Timestamp local_560;
  int64_t local_538;
  int local_52c;
  undefined1 local_528 [8];
  AssertionResult gtest_ar_13;
  Message local_510;
  Timestamp local_508;
  int64_t local_4e0;
  int local_4d4;
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar_12;
  Message local_4b8;
  Timestamp local_4b0;
  int64_t local_488;
  int local_47c;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_11;
  Message local_460;
  Timestamp local_458;
  int64_t local_430;
  int local_424;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_10;
  Message local_408;
  Timestamp local_400;
  int64_t local_3d8;
  int local_3cc;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_9;
  Message local_3b0;
  Timestamp local_3a8;
  int64_t local_380;
  int local_374;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_8;
  Message local_358;
  Timestamp local_350;
  string local_328;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_7;
  Message local_2f0;
  Timestamp local_2e8;
  string local_2c0;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_6;
  Message local_288;
  Timestamp local_280;
  string local_258;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_5;
  Message local_220;
  Timestamp local_218;
  string local_1f0;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_4;
  Message local_1b8;
  Timestamp local_1b0;
  string local_188;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_3;
  Message local_150;
  Timestamp local_148;
  string local_120;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_2;
  Message local_e8;
  Timestamp local_e0;
  string local_b8;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Message local_80 [3];
  Timestamp local_68;
  string local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  TestUtilTest_TimestampIntegerConversion_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  TimeUtil::NanosecondsToTimestamp(&local_68,1);
  TimeUtil::ToString_abi_cxx11_(&local_40,(TimeUtil *)&local_68,timestamp);
  testing::internal::EqHelper::
  Compare<char[31],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_20,"\"1970-01-01T00:00:00.000000001Z\"",
             "TimeUtil::ToString(TimeUtil::NanosecondsToTimestamp(1))",
             (char (*) [31])"1970-01-01T00:00:00.000000001Z",&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  Timestamp::~Timestamp(&local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xac,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  TimeUtil::NanosecondsToTimestamp(&local_e0,-1);
  TimeUtil::ToString_abi_cxx11_(&local_b8,(TimeUtil *)&local_e0,timestamp_00);
  testing::internal::EqHelper::
  Compare<char[31],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_98,"\"1969-12-31T23:59:59.999999999Z\"",
             "TimeUtil::ToString(TimeUtil::NanosecondsToTimestamp(-1))",
             (char (*) [31])"1969-12-31T23:59:59.999999999Z",&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  Timestamp::~Timestamp(&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xae,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  TimeUtil::MicrosecondsToTimestamp(&local_148,1);
  TimeUtil::ToString_abi_cxx11_(&local_120,(TimeUtil *)&local_148,timestamp_01);
  testing::internal::EqHelper::
  Compare<char[28],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_100,"\"1970-01-01T00:00:00.000001Z\"",
             "TimeUtil::ToString(TimeUtil::MicrosecondsToTimestamp(1))",
             (char (*) [28])"1970-01-01T00:00:00.000001Z",&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  Timestamp::~Timestamp(&local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  TimeUtil::MicrosecondsToTimestamp(&local_1b0,-1);
  TimeUtil::ToString_abi_cxx11_(&local_188,(TimeUtil *)&local_1b0,timestamp_02);
  testing::internal::EqHelper::
  Compare<char[28],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_168,"\"1969-12-31T23:59:59.999999Z\"",
             "TimeUtil::ToString(TimeUtil::MicrosecondsToTimestamp(-1))",
             (char (*) [28])"1969-12-31T23:59:59.999999Z",&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  Timestamp::~Timestamp(&local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xb2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  TimeUtil::MillisecondsToTimestamp(&local_218,1);
  TimeUtil::ToString_abi_cxx11_(&local_1f0,(TimeUtil *)&local_218,timestamp_03);
  testing::internal::EqHelper::
  Compare<char[25],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1d0,"\"1970-01-01T00:00:00.001Z\"",
             "TimeUtil::ToString(TimeUtil::MillisecondsToTimestamp(1))",
             (char (*) [25])"1970-01-01T00:00:00.001Z",&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  Timestamp::~Timestamp(&local_218);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xb4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  TimeUtil::MillisecondsToTimestamp(&local_280,-1);
  TimeUtil::ToString_abi_cxx11_(&local_258,(TimeUtil *)&local_280,timestamp_04);
  testing::internal::EqHelper::
  Compare<char[25],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_238,"\"1969-12-31T23:59:59.999Z\"",
             "TimeUtil::ToString(TimeUtil::MillisecondsToTimestamp(-1))",
             (char (*) [25])"1969-12-31T23:59:59.999Z",&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  Timestamp::~Timestamp(&local_280);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xb6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  TimeUtil::SecondsToTimestamp(&local_2e8,1);
  TimeUtil::ToString_abi_cxx11_(&local_2c0,(TimeUtil *)&local_2e8,timestamp_05);
  testing::internal::EqHelper::
  Compare<char[21],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_2a0,"\"1970-01-01T00:00:01Z\"",
             "TimeUtil::ToString(TimeUtil::SecondsToTimestamp(1))",
             (char (*) [21])"1970-01-01T00:00:01Z",&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  Timestamp::~Timestamp(&local_2e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xb8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  TimeUtil::SecondsToTimestamp(&local_350,-1);
  TimeUtil::ToString_abi_cxx11_(&local_328,(TimeUtil *)&local_350,timestamp_06);
  testing::internal::EqHelper::
  Compare<char[21],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_308,"\"1969-12-31T23:59:59Z\"",
             "TimeUtil::ToString(TimeUtil::SecondsToTimestamp(-1))",
             (char (*) [21])"1969-12-31T23:59:59Z",&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  Timestamp::~Timestamp(&local_350);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xba,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  local_374 = 1;
  TimeUtil::NanosecondsToTimestamp(&local_3a8,1);
  local_380 = TimeUtil::TimestampToNanoseconds(&local_3a8);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_370,"1",
             "TimeUtil::TimestampToNanoseconds(TimeUtil::NanosecondsToTimestamp(1))",&local_374,
             &local_380);
  Timestamp::~Timestamp(&local_3a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_3b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xbd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  local_3cc = -1;
  TimeUtil::NanosecondsToTimestamp(&local_400,-1);
  local_3d8 = TimeUtil::TimestampToNanoseconds(&local_400);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_3c8,"-1",
             "TimeUtil::TimestampToNanoseconds( TimeUtil::NanosecondsToTimestamp(-1))",&local_3cc,
             &local_3d8);
  Timestamp::~Timestamp(&local_400);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xbf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  local_424 = 1;
  TimeUtil::MicrosecondsToTimestamp(&local_458,1);
  local_430 = TimeUtil::TimestampToMicroseconds(&local_458);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_420,"1",
             "TimeUtil::TimestampToMicroseconds( TimeUtil::MicrosecondsToTimestamp(1))",&local_424,
             &local_430);
  Timestamp::~Timestamp(&local_458);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xc1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_460);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  local_47c = -1;
  TimeUtil::MicrosecondsToTimestamp(&local_4b0,-1);
  local_488 = TimeUtil::TimestampToMicroseconds(&local_4b0);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_478,"-1",
             "TimeUtil::TimestampToMicroseconds( TimeUtil::MicrosecondsToTimestamp(-1))",&local_47c,
             &local_488);
  Timestamp::~Timestamp(&local_4b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar1) {
    testing::Message::Message(&local_4b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xc3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_4b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_4b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  local_4d4 = 1;
  TimeUtil::MillisecondsToTimestamp(&local_508,1);
  local_4e0 = TimeUtil::TimestampToMilliseconds(&local_508);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_4d0,"1",
             "TimeUtil::TimestampToMilliseconds( TimeUtil::MillisecondsToTimestamp(1))",&local_4d4,
             &local_4e0);
  Timestamp::~Timestamp(&local_508);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
  if (!bVar1) {
    testing::Message::Message(&local_510);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xc5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_510);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
  local_52c = -1;
  TimeUtil::MillisecondsToTimestamp(&local_560,-1);
  local_538 = TimeUtil::TimestampToMilliseconds(&local_560);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_528,"-1",
             "TimeUtil::TimestampToMilliseconds( TimeUtil::MillisecondsToTimestamp(-1))",&local_52c,
             &local_538);
  Timestamp::~Timestamp(&local_560);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
  if (!bVar1) {
    testing::Message::Message(&local_568);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_528);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,199,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_568);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_568);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
  local_584 = 1;
  TimeUtil::SecondsToTimestamp(&local_5b8,1);
  local_590 = TimeUtil::TimestampToSeconds(&local_5b8);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_580,"1",
             "TimeUtil::TimestampToSeconds(TimeUtil::SecondsToTimestamp(1))",&local_584,&local_590);
  Timestamp::~Timestamp(&local_5b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
  if (!bVar1) {
    testing::Message::Message(&local_5c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_580);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,200,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_5c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
  local_5dc = -1;
  TimeUtil::SecondsToTimestamp(&local_610,-1);
  local_5e8 = TimeUtil::TimestampToSeconds(&local_610);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_5d8,"-1",
             "TimeUtil::TimestampToSeconds(TimeUtil::SecondsToTimestamp(-1))",&local_5dc,&local_5e8)
  ;
  Timestamp::~Timestamp(&local_610);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d8);
  if (!bVar1) {
    testing::Message::Message(&local_618);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xc9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_618);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
  local_634 = 1;
  TimeUtil::NanosecondsToTimestamp(&local_668,1999);
  local_640 = TimeUtil::TimestampToMicroseconds(&local_668);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_630,"1",
             "TimeUtil::TimestampToMicroseconds( TimeUtil::NanosecondsToTimestamp(1999))",&local_634
             ,&local_640);
  Timestamp::~Timestamp(&local_668);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_630);
  if (!bVar1) {
    testing::Message::Message(&local_670);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_630);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xcd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_670);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_670);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_630);
  local_68c = -2;
  TimeUtil::NanosecondsToTimestamp(&local_6c0,-1999);
  local_698 = TimeUtil::TimestampToMicroseconds(&local_6c0);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_688,"-2",
             "TimeUtil::TimestampToMicroseconds( TimeUtil::NanosecondsToTimestamp(-1999))",
             &local_68c,&local_698);
  Timestamp::~Timestamp(&local_6c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_688);
  if (!bVar1) {
    testing::Message::Message(&local_6c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_688);
    testing::internal::AssertHelper::AssertHelper
              (&local_6d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xd3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6d0,&local_6c8);
    testing::internal::AssertHelper::~AssertHelper(&local_6d0);
    testing::Message::~Message(&local_6c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_688);
  return;
}

Assistant:

TEST(TestUtilTest, TimestampIntegerConversion) {
  EXPECT_EQ("1970-01-01T00:00:00.000000001Z",
            TimeUtil::ToString(TimeUtil::NanosecondsToTimestamp(1)));
  EXPECT_EQ("1969-12-31T23:59:59.999999999Z",
            TimeUtil::ToString(TimeUtil::NanosecondsToTimestamp(-1)));
  EXPECT_EQ("1970-01-01T00:00:00.000001Z",
            TimeUtil::ToString(TimeUtil::MicrosecondsToTimestamp(1)));
  EXPECT_EQ("1969-12-31T23:59:59.999999Z",
            TimeUtil::ToString(TimeUtil::MicrosecondsToTimestamp(-1)));
  EXPECT_EQ("1970-01-01T00:00:00.001Z",
            TimeUtil::ToString(TimeUtil::MillisecondsToTimestamp(1)));
  EXPECT_EQ("1969-12-31T23:59:59.999Z",
            TimeUtil::ToString(TimeUtil::MillisecondsToTimestamp(-1)));
  EXPECT_EQ("1970-01-01T00:00:01Z",
            TimeUtil::ToString(TimeUtil::SecondsToTimestamp(1)));
  EXPECT_EQ("1969-12-31T23:59:59Z",
            TimeUtil::ToString(TimeUtil::SecondsToTimestamp(-1)));

  EXPECT_EQ(
      1, TimeUtil::TimestampToNanoseconds(TimeUtil::NanosecondsToTimestamp(1)));
  EXPECT_EQ(-1, TimeUtil::TimestampToNanoseconds(
                    TimeUtil::NanosecondsToTimestamp(-1)));
  EXPECT_EQ(1, TimeUtil::TimestampToMicroseconds(
                   TimeUtil::MicrosecondsToTimestamp(1)));
  EXPECT_EQ(-1, TimeUtil::TimestampToMicroseconds(
                    TimeUtil::MicrosecondsToTimestamp(-1)));
  EXPECT_EQ(1, TimeUtil::TimestampToMilliseconds(
                   TimeUtil::MillisecondsToTimestamp(1)));
  EXPECT_EQ(-1, TimeUtil::TimestampToMilliseconds(
                    TimeUtil::MillisecondsToTimestamp(-1)));
  EXPECT_EQ(1, TimeUtil::TimestampToSeconds(TimeUtil::SecondsToTimestamp(1)));
  EXPECT_EQ(-1, TimeUtil::TimestampToSeconds(TimeUtil::SecondsToTimestamp(-1)));

  // Test truncation behavior.
  EXPECT_EQ(1, TimeUtil::TimestampToMicroseconds(
                   TimeUtil::NanosecondsToTimestamp(1999)));
  // For negative values, Timestamp will be rounded down.
  // For example, "1969-12-31T23:59:59.5Z" (i.e., -0.5s) rounded to seconds
  // will be "1969-12-31T23:59:59Z" (i.e., -1s) rather than
  // "1970-01-01T00:00:00Z" (i.e., 0s).
  EXPECT_EQ(-2, TimeUtil::TimestampToMicroseconds(
                    TimeUtil::NanosecondsToTimestamp(-1999)));
}